

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

string * __thiscall
glcts::ViewportArray::DepthRangeDepthTest::getGeometryShader_abi_cxx11_
          (string *__return_storage_ptr__,DepthRangeDepthTest *this)

{
  GLchar *__s;
  allocator<char> local_1a;
  undefined1 local_19;
  DepthRangeDepthTest *local_18;
  DepthRangeDepthTest *this_local;
  string *result;
  
  __s = getGeometryShader::source;
  local_19 = 0;
  local_18 = this;
  this_local = (DepthRangeDepthTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  return __return_storage_ptr__;
}

Assistant:

std::string DepthRangeDepthTest::getGeometryShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "${GEOMETRY_SHADER_ENABLE}\n"
								  "${VIEWPORT_ARRAY_ENABLE}\n"
								  "\n"
								  "layout(points, invocations = 16)         in;\n"
								  "layout(triangle_strip, max_vertices = 8) out;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    const float top_z    = 1.0;\n"
								  "    const float bottom_z = -1.0;\n"
								  "\n"
								  "    /* Bottom */\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, -1, bottom_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, 0, bottom_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, -1, bottom_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, 0, bottom_z, 1);\n"
								  "    EmitVertex();\n"
								  "\n"
								  "    /* Top */\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, 0, top_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, 1, top_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, 0, top_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, 1, top_z, 1);\n"
								  "    EmitVertex();\n"
								  "    EndPrimitive();\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}